

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O1

bool __thiscall
SBPL2DGridSearch::search
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c,SBPL_2DGRIDSEARCH_TERM_CONDITION termination_condition)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this_00;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream ss;
  ostream local_198 [376];
  
  iVar1 = this->downsample_;
  if (this->OPENtype_ == SBPL_2DGRIDSEARCH_OPENTYPE_SLIDINGBUCKETS) {
    bVar2 = search_withslidingbuckets
                      (this,Grid2D,obsthresh,startx_c / iVar1,starty_c / iVar1,goalx_c / iVar1,
                       goaly_c / iVar1,termination_condition);
  }
  else {
    if (this->OPENtype_ != SBPL_2DGRIDSEARCH_OPENTYPE_HEAP) {
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"ERROR: unknown data structure type = ","");
      std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)local_1c8,_S_out|_S_in)
      ;
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_198,this->OPENtype_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," for OPEN2D",0xb);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)local_1c8);
      *(undefined ***)this_00 = &PTR__runtime_error_001574d0;
      __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = search_withheap(this,Grid2D,obsthresh,startx_c / iVar1,starty_c / iVar1,goalx_c / iVar1,
                            goaly_c / iVar1,termination_condition);
  }
  return bVar2;
}

Assistant:

bool SBPL2DGridSearch::search(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c, int goalx_c,
                              int goaly_c, SBPL_2DGRIDSEARCH_TERM_CONDITION termination_condition)
{
    startx_c /= downsample_;
    starty_c /= downsample_;
    goalx_c /= downsample_;
    goaly_c /= downsample_;

    switch (OPENtype_) {
    case SBPL_2DGRIDSEARCH_OPENTYPE_HEAP:
        return SBPL2DGridSearch::search_withheap(Grid2D, obsthresh, startx_c, starty_c, goalx_c, goaly_c,
                                                 termination_condition);
        break;
    case SBPL_2DGRIDSEARCH_OPENTYPE_SLIDINGBUCKETS:
        return SBPL2DGridSearch::search_withslidingbuckets(Grid2D, obsthresh, startx_c, starty_c, goalx_c, goaly_c,
                                                           termination_condition);
        break;
    default:
        std::stringstream ss("ERROR: unknown data structure type = ");
        ss << OPENtype_ << " for OPEN2D";
        throw SBPL_Exception(ss.str());
    };
    return false;
}